

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

primitive_feature_space * VW::export_example(vw *all,example *ec,size_t *len)

{
  float *pfVar1;
  byte bVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  float *pfVar6;
  float *pfVar7;
  unsigned_long *puVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  primitive_feature_space *ppVar11;
  feature *pfVar12;
  uint32_t *puVar13;
  long lVar14;
  features *__range2;
  feature *pfVar15;
  long lVar16;
  long lVar17;
  
  puVar4 = (ec->super_example_predict).indices._end;
  puVar5 = (ec->super_example_predict).indices._begin;
  uVar10 = (long)puVar4 - (long)puVar5;
  *len = uVar10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar10;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar9 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar9 * ZEXT816(0x18),0);
  }
  ppVar11 = (primitive_feature_space *)operator_new__(uVar10);
  lVar17 = (long)puVar4 - (long)puVar5;
  if (lVar17 != 0) {
    puVar4 = (ec->super_example_predict).indices._begin;
    puVar13 = &(all->weights).dense_weights._stride_shift;
    if (((all->weights).sparse & 1U) != 0) {
      puVar13 = &(all->weights).sparse_weights._stride_shift;
    }
    uVar3 = *puVar13;
    lVar14 = 0;
    do {
      bVar2 = puVar4[lVar14];
      ppVar11[lVar14].name = bVar2;
      pfVar6 = (ec->super_example_predict).feature_space[bVar2].values._begin;
      pfVar7 = (ec->super_example_predict).feature_space[bVar2].values._end;
      uVar10 = (long)pfVar7 - (long)pfVar6 >> 2;
      ppVar11[lVar14].len = uVar10;
      pfVar12 = (feature *)
                operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | ((long)pfVar7 - (long)pfVar6) * 4);
      if (pfVar7 == pfVar6) {
        ppVar11[lVar14].fs = pfVar12;
      }
      else {
        pfVar15 = pfVar12;
        do {
          pfVar15->x = 0.0;
          pfVar15->weight_index = 0;
          pfVar15 = pfVar15 + 1;
        } while (pfVar15 != pfVar12 + uVar10);
        ppVar11[lVar14].fs = pfVar12;
        if (pfVar7 != pfVar6) {
          puVar8 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
          lVar16 = 0;
          do {
            pfVar1 = (float *)(lVar16 + (long)pfVar6);
            uVar10 = *(ulong *)((long)puVar8 + lVar16 * 2);
            (&pfVar12->x)[lVar16] = *pfVar1;
            *(ulong *)((long)&pfVar12->weight_index + lVar16 * 4) = uVar10 >> ((byte)uVar3 & 0x3f);
            lVar16 = lVar16 + 4;
          } while (pfVar1 + 1 != pfVar7);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar17 + (ulong)(lVar17 == 0));
  }
  return ppVar11;
}

Assistant:

primitive_feature_space* export_example(vw& all, example* ec, size_t& len)
{
  len = ec->indices.size();
  primitive_feature_space* fs_ptr = new primitive_feature_space[len];

  int fs_count = 0;

  for (size_t idx = 0; idx < len; ++idx)
  {
    namespace_index i = ec->indices[idx];
    fs_ptr[fs_count].name = i;
    fs_ptr[fs_count].len = ec->feature_space[i].size();
    fs_ptr[fs_count].fs = new feature[fs_ptr[fs_count].len];

    uint32_t stride_shift = all.weights.stride_shift();
    int f_count = 0;
    for (features::iterator& f : ec->feature_space[i])
    {
      feature t = {f.value(), f.index()};
      t.weight_index >>= stride_shift;
      fs_ptr[fs_count].fs[f_count] = t;
      f_count++;
    }
    fs_count++;
  }
  return fs_ptr;
}